

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  int iVar1;
  long lVar2;
  sqlite3_int64 iDiff;
  char *pcStack_88;
  int bFirstOut;
  char *aOut;
  char *p;
  char *p2;
  char *p1;
  char *pEnd2;
  char *pEnd1;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  char **ppcStack_38;
  int rc;
  char **paOut_local;
  char *pcStack_28;
  int n2_local;
  char *a2_local;
  char *pcStack_18;
  int n1_local;
  char *a1_local;
  int bDescDoclist_local;
  
  i1._4_4_ = 0;
  i2 = 0;
  iPrev = 0;
  pEnd1 = (char *)0x0;
  pEnd2 = a1 + n1;
  p1 = a2 + n2;
  iDiff._4_4_ = 0;
  *paOut = (char *)0x0;
  *pnOut = 0;
  p = a2;
  p2 = a1;
  ppcStack_38 = paOut;
  paOut_local._4_4_ = n2;
  pcStack_28 = a2;
  a2_local._4_4_ = n1;
  pcStack_18 = a1;
  a1_local._0_4_ = bDescDoclist;
  pcStack_88 = (char *)sqlite3_malloc64((long)n1 + (long)n2 + 0x11);
  if (pcStack_88 == (char *)0x0) {
    a1_local._4_4_ = 7;
  }
  else {
    aOut = pcStack_88;
    fts3GetDeltaVarint3(&p2,pEnd2,0,&i2);
    fts3GetDeltaVarint3(&p,p1,0,&iPrev);
    while (p2 != (char *)0x0 || p != (char *)0x0) {
      iVar1 = 1;
      if ((int)a1_local != 0) {
        iVar1 = -1;
      }
      lVar2 = (long)iVar1 * (i2 - iPrev);
      if (((p == (char *)0x0) || (p2 == (char *)0x0)) || (lVar2 != 0)) {
        if ((p == (char *)0x0) || ((p2 != (char *)0x0 && (lVar2 < 0)))) {
          fts3PutDeltaVarint3(&aOut,(int)a1_local,(sqlite3_int64 *)&pEnd1,(int *)((long)&iDiff + 4),
                              i2);
          fts3PoslistCopy(&aOut,&p2);
          fts3GetDeltaVarint3(&p2,pEnd2,(int)a1_local,&i2);
        }
        else {
          fts3PutDeltaVarint3(&aOut,(int)a1_local,(sqlite3_int64 *)&pEnd1,(int *)((long)&iDiff + 4),
                              iPrev);
          fts3PoslistCopy(&aOut,&p);
          fts3GetDeltaVarint3(&p,p1,(int)a1_local,&iPrev);
        }
      }
      else {
        fts3PutDeltaVarint3(&aOut,(int)a1_local,(sqlite3_int64 *)&pEnd1,(int *)((long)&iDiff + 4),i2
                           );
        i1._4_4_ = fts3PoslistMerge(&aOut,&p2,&p);
        if (i1._4_4_ != 0) break;
        fts3GetDeltaVarint3(&p2,pEnd2,(int)a1_local,&i2);
        fts3GetDeltaVarint3(&p,p1,(int)a1_local,&iPrev);
      }
    }
    if (i1._4_4_ == 0) {
      memset(aOut,0,8);
    }
    else {
      sqlite3_free(pcStack_88);
      pcStack_88 = (char *)0x0;
      aOut = (char *)0x0;
    }
    *ppcStack_38 = pcStack_88;
    *pnOut = (int)aOut - (int)pcStack_88;
    a1_local._4_4_ = i1._4_4_;
  }
  return a1_local._4_4_;
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the 
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list 
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from 
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow. 
  **
  ** A symetric argument may be made if the doclists are in descending 
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}